

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * anon_unknown.dwarf_878ee9::GetScanCommand
                   (string *__return_storage_ptr__,string *cmakeCmd,string *tdi,string *lang,
                   string *ppFile,string *ddiFile)

{
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  local_40.View_._M_str = (cmakeCmd->_M_dataplus)._M_p;
  local_40.View_._M_len = cmakeCmd->_M_string_length;
  local_70.View_._M_len = 0x1e;
  local_70.View_._M_str = " -E cmake_ninja_depends --tdi=";
  cmStrCat<std::__cxx11::string,char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[40],std::__cxx11::string>
            (__return_storage_ptr__,&local_40,&local_70,tdi,(char (*) [9])0x586750,lang,
             (char (*) [7])0x585f6c,ppFile,(char (*) [40])" --dep=$DEP_FILE --obj=$OBJ_FILE --ddi=",
             ddiFile);
  return __return_storage_ptr__;
}

Assistant:

std::string GetScanCommand(const std::string& cmakeCmd, const std::string& tdi,
                           const std::string& lang, const std::string& ppFile,
                           const std::string& ddiFile)
{
  return cmStrCat(cmakeCmd, " -E cmake_ninja_depends --tdi=", tdi,
                  " --lang=", lang, " --pp=", ppFile,
                  " --dep=$DEP_FILE --obj=$OBJ_FILE --ddi=", ddiFile);
}